

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorBase::GenerateMemberConstexprConstructor
          (FieldGeneratorBase *this,Printer *p)

{
  bool bVar1;
  FieldDescriptor *in_RCX;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  Sub local_c8;
  
  if ((this->field_->field_0x1 & 8) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field.cc"
               ,0x9a,"!field_->is_extension()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_c8);
  }
  bVar1 = FieldDescriptor::is_repeated(this->field_);
  if (bVar1) {
    io::Printer::Emit(p,9,"$name$_{}");
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"default",&local_109);
  DefaultValue_abi_cxx11_(&local_108,(cpp *)this->options_,(Options *)this->field_,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_c8,&local_e8,&local_108);
  io::Printer::Emit(p,&local_c8,1,0x12,"$name$_{$default$}");
  io::Printer::Sub::~Sub(&local_c8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void FieldGeneratorBase::GenerateMemberConstexprConstructor(
    io::Printer* p) const {
  ABSL_CHECK(!field_->is_extension());
  if (field_->is_repeated()) {
    p->Emit("$name$_{}");
  } else {
    p->Emit({{"default", DefaultValue(options_, field_)}},
            "$name$_{$default$}");
  }
}